

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_String_Test::~PrintfTest_String_Test(PrintfTest_String_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_String_Test((PrintfTest_String_Test *)0x140ba8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, String) {
  EXPECT_PRINTF("abc", "%s", "abc");
  const char *null_str = FMT_NULL;
  EXPECT_PRINTF("(null)", "%s", null_str);
  EXPECT_PRINTF("    (null)", "%10s", null_str);
  EXPECT_PRINTF(L"abc", L"%s", L"abc");
  const wchar_t *null_wstr = FMT_NULL;
  EXPECT_PRINTF(L"(null)", L"%s", null_wstr);
  EXPECT_PRINTF(L"    (null)", L"%10s", null_wstr);
}